

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_null(mg_session *session)

{
  int iVar1;
  uint8_t marker;
  uint8_t local_9;
  
  iVar1 = mg_session_read_uint8(session,&local_9);
  if ((iVar1 == 0) && (iVar1 = 0, local_9 != 0xc0)) {
    mg_session_set_error(session,"wrong value marker");
    iVar1 = -6;
  }
  return iVar1;
}

Assistant:

int mg_session_read_null(mg_session *session) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));
  if (marker != MG_MARKER_NULL) {
    mg_session_set_error(session, "wrong value marker");
    return MG_ERROR_DECODING_FAILED;
  }
  return 0;
}